

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.h
# Opt level: O2

void __thiscall AccountInfoWrap::AccountInfoWrap(AccountInfoWrap *this,AccountInfoWrap *rhs)

{
  pointer pcVar1;
  
  tquant::api::AccountInfo::AccountInfo(&this->m_orig);
  tquant::api::AccountInfo::operator=(&this->m_orig,&rhs->m_orig);
  pcVar1 = (this->m_orig).broker._M_dataplus._M_p;
  this->account_id = (this->m_orig).account_id._M_dataplus._M_p;
  this->broker = pcVar1;
  this->account = (this->m_orig).account._M_dataplus._M_p;
  this->status = (this->m_orig).status._M_dataplus._M_p;
  this->msg = (this->m_orig).msg._M_dataplus._M_p;
  this->account_type = (this->m_orig).account_type._M_dataplus._M_p;
  return;
}

Assistant:

AccountInfoWrap(const AccountInfoWrap& rhs)
	{
		m_orig = rhs.m_orig;
        account_id   = m_orig.account_id  .c_str();
        broker       = m_orig.broker      .c_str();
        account      = m_orig.account     .c_str();
        status       = m_orig.status      .c_str();
        msg          = m_orig.msg         .c_str();
        account_type = m_orig.account_type.c_str();
	}